

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O2

bool __thiscall
Bitmap_Operation::BitmapCoreHeader::validate(BitmapCoreHeader *this,BitmapFileHeader *header)

{
  bool bVar1;
  
  bVar1 = true;
  if (((((ulong)this->bcBitCount < 0x21) &&
       ((0x101000100U >> ((ulong)this->bcBitCount & 0x3f) & 1) != 0)) && (this->bcWidth != 0)) &&
     (((this->bcHeight != 0 && (this->bcSize == 0xc)) && (this->bcPlanes == 1)))) {
    bVar1 = header->bfOffBits < header->overallSize + this->overallSize;
  }
  return bVar1;
}

Assistant:

virtual bool validate( const BitmapFileHeader & header )
        {
            return !(bcBitCount == 8u || bcBitCount == 24u || bcBitCount == 32u) ||
                bcWidth == 0 || bcHeight == 0 || bcSize != BitmapCoreHeader().bcSize ||
                bcPlanes != BitmapCoreHeader().bcPlanes || header.bfOffBits < overallSize + header.overallSize;
        }